

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSwap
          (MessageGenerator *this,Printer *printer)

{
  string *value1;
  uint uVar1;
  pointer ppFVar2;
  FieldGenerator *pFVar3;
  Descriptor *pDVar4;
  uint uVar5;
  int iVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  int i;
  string local_50;
  
  pcVar9 = 
  "void $classname$::Swap($classname$* other) {\n  if (other == this) return;\n  InternalSwap(other);\n}\n"
  ;
  if (*(char *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa7) != '\0') {
    pcVar9 = 
    "void $classname$::Swap($classname$* other) {\n  if (other == this) return;\n  if (GetArenaNoVirtual() == other->GetArenaNoVirtual()) {\n    InternalSwap(other);\n  } else {\n    $classname$* temp = New(GetArenaNoVirtual());\n    temp->MergeFrom(*other);\n    other->CopyFrom(*this);\n    InternalSwap(temp);\n    if (GetArenaNoVirtual() == NULL) {\n      delete temp;\n    }\n  }\n}\nvoid $classname$::UnsafeArenaSwap($classname$* other) {\n  if (other == this) return;\n  GOOGLE_DCHECK(GetArenaNoVirtual() == other->GetArenaNoVirtual());\n  InternalSwap(other);\n}\n"
    ;
  }
  io::Printer::Print(printer,pcVar9,"classname",&this->classname_);
  io::Printer::Print(printer,"void $classname$::InternalSwap($classname$* other) {\n","classname",
                     &this->classname_);
  io::Printer::Indent(printer);
  if (((this->options_).enforce_lite == false) &&
     (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) == 2)) {
    pcVar9 = "GetReflection()->Swap(this, other);";
  }
  else {
    ppFVar2 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = extraout_RDX;
    if ((this->optimized_order_).
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppFVar2) {
      uVar10 = 0;
      do {
        pFVar3 = FieldGeneratorMap::get(&this->field_generators_,ppFVar2[uVar10]);
        (*pFVar3->_vptr_FieldGenerator[0xd])(pFVar3,printer);
        uVar10 = uVar10 + 1;
        ppFVar2 = (this->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar7 = extraout_RDX_00;
      } while (uVar10 < (ulong)((long)(this->optimized_order_).
                                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2 >>
                               3));
    }
    pDVar4 = this->descriptor_;
    if (0 < *(int *)(pDVar4 + 0x38)) {
      lVar8 = 0;
      uVar10 = 0;
      do {
        value1 = *(string **)(*(long *)(pDVar4 + 0x40) + lVar8);
        SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(uVar10 & 0xffffffff),(int)uVar7);
        io::Printer::Print(printer,
                           "std::swap($oneof_name$_, other->$oneof_name$_);\nstd::swap(_oneof_case_[$i$], other->_oneof_case_[$i$]);\n"
                           ,"oneof_name",value1,"i",&local_50);
        uVar7 = extraout_RDX_01;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          uVar7 = extraout_RDX_02;
        }
        uVar10 = uVar10 + 1;
        pDVar4 = this->descriptor_;
        lVar8 = lVar8 + 0x30;
      } while ((long)uVar10 < (long)*(int *)(pDVar4 + 0x38));
    }
    if (*(int *)(*(long *)(pDVar4 + 0x10) + 0x8c) != 3) {
      uVar10 = 0;
      do {
        SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(uVar10 & 0xffffffff),(int)uVar7);
        io::Printer::Print(printer,"std::swap(_has_bits_[$i$], other->_has_bits_[$i$]);\n","i",
                           &local_50);
        uVar7 = extraout_RDX_03;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          uVar7 = extraout_RDX_04;
        }
        uVar10 = uVar10 + 1;
        uVar5 = this->max_has_bit_index_ + 0x1f;
        uVar1 = this->max_has_bit_index_ + 0x3e;
        if ((int)uVar5 < 0) {
          uVar5 = uVar1;
        }
        iVar6 = ((int)uVar5 >> 5) << 2;
        if (uVar1 < 0x3f) {
          iVar6 = 4;
        }
      } while (uVar10 < (ulong)(long)iVar6 >> 2);
    }
    if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
      io::Printer::Print(printer,"_internal_metadata_.Swap(&other->_internal_metadata_);\n");
    }
    io::Printer::Print(printer,"std::swap(_cached_size_, other->_cached_size_);\n");
    if (0 < *(int *)(this->descriptor_ + 0x68)) {
      io::Printer::Print(printer,"_extensions_.Swap(&other->_extensions_);\n");
    }
    if (this->num_weak_fields_ == 0) goto LAB_0025cf31;
    pcVar9 = "_weak_field_map_.UnsafeArenaSwap(&other->_weak_field_map_);\n";
  }
  io::Printer::Print(printer,pcVar9);
LAB_0025cf31:
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateSwap(io::Printer* printer) {
  if (SupportsArenas(descriptor_)) {
    // Generate the Swap member function. This is a lightweight wrapper around
    // UnsafeArenaSwap() / MergeFrom() with temporaries, depending on the memory
    // ownership situation: swapping across arenas or between an arena and a
    // heap requires copying.
    printer->Print(
        "void $classname$::Swap($classname$* other) {\n"
        "  if (other == this) return;\n"
        "  if (GetArenaNoVirtual() == other->GetArenaNoVirtual()) {\n"
        "    InternalSwap(other);\n"
        "  } else {\n"
        "    $classname$* temp = New(GetArenaNoVirtual());\n"
        "    temp->MergeFrom(*other);\n"
        "    other->CopyFrom(*this);\n"
        "    InternalSwap(temp);\n"
        "    if (GetArenaNoVirtual() == NULL) {\n"
        "      delete temp;\n"
        "    }\n"
        "  }\n"
        "}\n"
        "void $classname$::UnsafeArenaSwap($classname$* other) {\n"
        "  if (other == this) return;\n"
        "  GOOGLE_DCHECK(GetArenaNoVirtual() == other->GetArenaNoVirtual());\n"
        "  InternalSwap(other);\n"
        "}\n",
        "classname", classname_);
  } else {
    printer->Print(
        "void $classname$::Swap($classname$* other) {\n"
        "  if (other == this) return;\n"
        "  InternalSwap(other);\n"
        "}\n",
        "classname", classname_);
  }

  // Generate the UnsafeArenaSwap member function.
  printer->Print("void $classname$::InternalSwap($classname$* other) {\n",
                 "classname", classname_);
  printer->Indent();

  if (HasGeneratedMethods(descriptor_->file(), options_)) {
    for (int i = 0; i < optimized_order_.size(); i++) {
      // optimized_order_ does not contain oneof fields, but the field
      // generators for these fields do not emit swapping code on their own.
      const FieldDescriptor* field = optimized_order_[i];
      field_generators_.get(field).GenerateSwappingCode(printer);
    }

    for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
      printer->Print(
        "std::swap($oneof_name$_, other->$oneof_name$_);\n"
        "std::swap(_oneof_case_[$i$], other->_oneof_case_[$i$]);\n",
        "oneof_name", descriptor_->oneof_decl(i)->name(),
        "i", SimpleItoa(i));
    }

    if (HasFieldPresence(descriptor_->file())) {
      for (int i = 0; i < HasBitsSize() / 4; ++i) {
        printer->Print("std::swap(_has_bits_[$i$], other->_has_bits_[$i$]);\n",
                       "i", SimpleItoa(i));
      }
    }

    if (PreserveUnknownFields(descriptor_)) {
      printer->Print("_internal_metadata_.Swap(&other->_internal_metadata_);\n");
    }

    printer->Print("std::swap(_cached_size_, other->_cached_size_);\n");
    if (descriptor_->extension_range_count() > 0) {
      printer->Print("_extensions_.Swap(&other->_extensions_);\n");
    }
    if (num_weak_fields_) {
      printer->Print(
          "_weak_field_map_.UnsafeArenaSwap(&other->_weak_field_map_);\n");
    }
  } else {
    printer->Print("GetReflection()->Swap(this, other);");
  }

  printer->Outdent();
  printer->Print("}\n");
}